

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

void sysbvm_functionCallFrameStack_begin
               (sysbvm_context_t *context,sysbvm_functionCallFrameStack_t *callFrameStack,
               sysbvm_tuple_t function,size_t argumentCount,sysbvm_bitflags_t applicationFlags)

{
  uint uVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  byte bVar5;
  _Bool _Var6;
  _Bool *local_40;
  
  (callFrameStack->gcRoots).function = function;
  if ((function & 0xf) == 0 && function != 0) {
    uVar4 = *(ulong *)function;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar1 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar1 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
      if ((uVar1 >> 0xc & 1) == 0) goto LAB_0011271c;
      uVar4 = *(ulong *)(function + 0x28);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        bVar5 = (byte)((long)uVar4 >> 4);
      }
      else {
        bVar5 = (byte)*(undefined8 *)(uVar4 + 0x10);
      }
    }
    else {
LAB_0011271c:
      bVar5 = 0;
    }
    _Var6 = (_Bool)(bVar5 >> 1 & 1);
    callFrameStack->isVariadic = _Var6;
    uVar4 = *(ulong *)function;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar1 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar1 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
      if ((uVar1 >> 0xc & 1) != 0) {
        uVar4 = *(ulong *)(function + 0x28);
        if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
          uVar4 = (long)uVar4 >> 4;
        }
        else {
          uVar4 = *(ulong *)(uVar4 + 0x10);
        }
        goto LAB_00112797;
      }
    }
  }
  else {
    callFrameStack->isVariadic = false;
    _Var6 = false;
  }
  uVar4 = 0;
LAB_00112797:
  local_40 = &callFrameStack->isVariadic;
  callFrameStack->isMemoizedTemplate = (uVar4 & 0x600) == 0x600;
  callFrameStack->applicationFlags = applicationFlags;
  sVar2 = sysbvm_function_getArgumentCount(context,function);
  callFrameStack->expectedArgumentCount = sVar2;
  callFrameStack->variadicArgumentIndex = 0;
  callFrameStack->argumentIndex = 0;
  if ((applicationFlags & 3) != 0) {
    *local_40 = false;
    _Var6 = false;
  }
  if ((int)(uVar4 & 0x600) == 0x600) {
    if (sVar2 == 0) {
      sysbvm_error("Memoized template function requires at least a single argument.");
    }
    callFrameStack->expectedArgumentCount = sVar2 - 1;
    sVar2 = sVar2 - 1;
  }
  if (_Var6 == false) {
    if (sVar2 != argumentCount) {
      sysbvm_error("Function call does not receive the required number of arguments.");
    }
  }
  else {
    if (sVar2 == 0) {
      sysbvm_error("Variadic functions require at least a single argument.");
    }
    uVar4 = sVar2 - 1;
    callFrameStack->variadicArgumentIndex = uVar4;
    if (argumentCount < uVar4) {
      sysbvm_error("Missing required argument count.");
    }
    sVar3 = sysbvm_array_create(context,argumentCount - uVar4);
    (callFrameStack->gcRoots).applicationArguments[callFrameStack->variadicArgumentIndex] = sVar3;
  }
  if ((0x10 < argumentCount) && (*local_40 == false)) {
    sysbvm_error("Function application direct arguments exceeds the max argument count.");
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionCallFrameStack_begin(sysbvm_context_t *context, sysbvm_functionCallFrameStack_t *callFrameStack, sysbvm_tuple_t function, size_t argumentCount, sysbvm_bitflags_t applicationFlags)
{
    callFrameStack->gcRoots.function = function;
    callFrameStack->isVariadic = sysbvm_function_isVariadic(context, callFrameStack->gcRoots.function);
    callFrameStack->isMemoizedTemplate = sysbvm_function_isMemoizedTemplate(context, callFrameStack->gcRoots.function);
    callFrameStack->applicationFlags = applicationFlags;
    callFrameStack->expectedArgumentCount = sysbvm_function_getArgumentCount(context, callFrameStack->gcRoots.function);
    callFrameStack->argumentIndex = 0;
    callFrameStack->variadicArgumentIndex = 0;

    if(applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK))
        callFrameStack->isVariadic = false;

    size_t requiredArgumentCount = callFrameStack->expectedArgumentCount;
    if(callFrameStack->isMemoizedTemplate)
    {
        if(callFrameStack->expectedArgumentCount == 0)
            sysbvm_error("Memoized template function requires at least a single argument.");
        --callFrameStack->expectedArgumentCount;
        --requiredArgumentCount;
    }

    if(callFrameStack->isVariadic)
    {
        if(requiredArgumentCount == 0)
            sysbvm_error("Variadic functions require at least a single argument.");
        callFrameStack->variadicArgumentIndex = requiredArgumentCount - 1;

        --requiredArgumentCount;
        if(argumentCount < requiredArgumentCount)
            sysbvm_error("Missing required argument count.");

        size_t variadicArgumentCount = argumentCount - requiredArgumentCount;
        callFrameStack->gcRoots.applicationArguments[callFrameStack->variadicArgumentIndex] = sysbvm_array_create(context, variadicArgumentCount);
    }
    else
    {
        if(argumentCount != requiredArgumentCount)
            sysbvm_error("Function call does not receive the required number of arguments.");
    }

    if(argumentCount > SYSBVM_MAX_FUNCTION_ARGUMENTS && !callFrameStack->isVariadic)
        sysbvm_error("Function application direct arguments exceeds the max argument count.");
    
}